

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int emit_esni_extension(ptls_esni_secret_t *esni,ptls_buffer_t *buf,ptls_iovec_t esni_keys,
                       char *server_name,size_t key_share_ch_off,size_t key_share_ch_len)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  bool bVar5;
  ptls_aead_context_t *ppVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t bytes_to_pad;
  ulong uVar10;
  size_t delta;
  size_t sVar11;
  ptls_aead_context_t *aead;
  char *local_38;
  
  aead = (ptls_aead_context_t *)0x0;
  iVar7 = create_esni_aead(&aead,1,(esni->client).cipher,esni->secret,esni->esni_contents_hash);
  if (iVar7 != 0) goto LAB_0011104f;
  uVar1 = ((esni->client).cipher)->id;
  local_38 = server_name;
  iVar7 = ptls_buffer_reserve(buf,2);
  if (iVar7 == 0) {
    *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
    buf->off = buf->off + 2;
    iVar7 = 0;
  }
  if ((iVar7 != 0) ||
     (iVar7 = push_key_share_entry(buf,((esni->client).key_share)->id,(esni->client).pubkey),
     iVar7 != 0)) goto LAB_0011104f;
  iVar7 = ptls_buffer_reserve(buf,2);
  if (iVar7 == 0) {
    puVar2 = buf->base;
    sVar11 = buf->off;
    (puVar2 + sVar11)[0] = '\0';
    (puVar2 + sVar11)[1] = '\0';
    buf->off = buf->off + 2;
    iVar7 = 0;
  }
  if (iVar7 == 0) {
    sVar11 = buf->off;
    iVar7 = ptls_buffer__do_pushv
                      (buf,(esni->client).record_digest,((esni->client).cipher)->hash->digest_size);
    if (iVar7 != 0) goto LAB_001110f0;
    uVar8 = buf->off - sVar11;
    lVar9 = 8;
    do {
      buf->base[sVar11 - 2] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
      lVar9 = lVar9 + -8;
      sVar11 = sVar11 + 1;
    } while (lVar9 != -8);
    iVar7 = 0;
    bVar5 = true;
  }
  else {
LAB_001110f0:
    bVar5 = false;
  }
  if (!bVar5) goto LAB_0011104f;
  iVar7 = ptls_buffer_reserve(buf,2);
  if (iVar7 == 0) {
    puVar2 = buf->base;
    sVar11 = buf->off;
    (puVar2 + sVar11)[0] = '\0';
    (puVar2 + sVar11)[1] = '\0';
    buf->off = buf->off + 2;
    iVar7 = 0;
  }
  bVar5 = true;
  if (iVar7 == 0) {
    sVar11 = buf->off;
    iVar7 = ptls_buffer_reserve(buf,0x10);
    if (iVar7 == 0) {
      puVar2 = buf->base;
      sVar3 = buf->off;
      uVar4 = *(undefined8 *)(esni->nonce + 8);
      *(undefined8 *)(puVar2 + sVar3) = *(undefined8 *)esni->nonce;
      *(undefined8 *)(puVar2 + sVar3 + 8) = uVar4;
      buf->off = buf->off + 0x10;
      iVar7 = 0;
    }
    bVar5 = true;
    if (iVar7 == 0) {
      iVar7 = emit_server_name_extension(buf,(char *)esni_keys.base);
      if (iVar7 == 0) {
        uVar8 = buf->off - sVar11;
        uVar10 = (ulong)(esni->client).padded_length + 0x10;
        delta = uVar10 - uVar8;
        if (uVar8 <= uVar10 && delta != 0) {
          iVar7 = ptls_buffer_reserve(buf,delta);
          bVar5 = true;
          if (iVar7 != 0) goto LAB_0011121e;
          memset(buf->base + buf->off,0,delta);
          buf->off = buf->off + delta;
        }
        ppVar6 = aead;
        iVar7 = ptls_buffer_reserve(buf,aead->algo->tag_size);
        if (iVar7 == 0) {
          puVar2 = buf->base + sVar11;
          (*ppVar6->do_encrypt)
                    (ppVar6,puVar2,puVar2,buf->off - sVar11,0,buf->base + esni_keys.len,
                     (size_t)local_38,(ptls_aead_supplementary_encryption_t *)0x0);
          buf->off = buf->off + ppVar6->algo->tag_size;
          bVar5 = false;
          iVar7 = 0;
          goto LAB_0011121e;
        }
      }
      bVar5 = true;
    }
LAB_0011121e:
    if (!bVar5) {
      uVar8 = buf->off - sVar11;
      lVar9 = 8;
      do {
        buf->base[sVar11 - 2] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
        lVar9 = lVar9 + -8;
        sVar11 = sVar11 + 1;
      } while (lVar9 != -8);
      bVar5 = false;
    }
  }
  if (!bVar5) {
    if (bVar5) {
      return iVar7;
    }
    iVar7 = 0;
  }
LAB_0011104f:
  ppVar6 = aead;
  if (aead != (ptls_aead_context_t *)0x0) {
    (*aead->dispose_crypto)(aead);
    free(ppVar6);
  }
  return iVar7;
}

Assistant:

static int emit_esni_extension(ptls_esni_secret_t *esni, ptls_buffer_t *buf, ptls_iovec_t esni_keys, const char *server_name,
                               size_t key_share_ch_off, size_t key_share_ch_len)
{
    ptls_aead_context_t *aead = NULL;
    int ret;

    if ((ret = create_esni_aead(&aead, 1, esni->client.cipher, esni->secret, esni->esni_contents_hash)) != 0)
        goto Exit;

    /* cipher-suite id */
    ptls_buffer_push16(buf, esni->client.cipher->id);
    /* key-share */
    if ((ret = push_key_share_entry(buf, esni->client.key_share->id, esni->client.pubkey)) != 0)
        goto Exit;
    /* record-digest */
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, esni->client.record_digest, esni->client.cipher->hash->digest_size); });
    /* encrypted sni */
    ptls_buffer_push_block(buf, 2, {
        size_t start_off = buf->off;
        /* nonce */
        ptls_buffer_pushv(buf, esni->nonce, PTLS_ESNI_NONCE_SIZE);
        /* emit server-name extension */
        if ((ret = emit_server_name_extension(buf, server_name)) != 0)
            goto Exit;
        /* pad */
        if (buf->off - start_off < (size_t)(esni->client.padded_length + PTLS_ESNI_NONCE_SIZE)) {
            size_t bytes_to_pad = esni->client.padded_length + PTLS_ESNI_NONCE_SIZE - (buf->off - start_off);
            if ((ret = ptls_buffer_reserve(buf, bytes_to_pad)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, bytes_to_pad);
            buf->off += bytes_to_pad;
        }
        /* encrypt */
        if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
            goto Exit;
        ptls_aead_encrypt(aead, buf->base + start_off, buf->base + start_off, buf->off - start_off, 0, buf->base + key_share_ch_off,
                          key_share_ch_len);
        buf->off += aead->algo->tag_size;
    });

    ret = 0;
Exit:
    if (aead != NULL)
        ptls_aead_free(aead);
    return ret;
}